

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

OptionValue * __thiscall cxxopts::ParseResult::operator[](ParseResult *this,string *option)

{
  bool bVar1;
  pointer pvVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false> local_30;
  const_iterator viter;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_20;
  const_iterator iter;
  string *option_local;
  ParseResult *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               )option;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->m_keys,option);
  viter.super__Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false>)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end(&this->m_keys);
  bVar1 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      *)&viter);
  if (bVar1) {
    throw_or_mimic<cxxopts::option_not_present_exception>
              ((string *)
               iter.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               ._M_cur);
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                         *)&local_20);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
       ::find(&this->m_values,&pvVar2->second);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
       ::end(&this->m_values);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    throw_or_mimic<cxxopts::option_not_present_exception>
              ((string *)
               iter.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               ._M_cur);
  }
  pvVar3 = std::__detail::
           _Node_const_iterator<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false,_false>
                         *)&local_30);
  return &pvVar3->second;
}

Assistant:

const OptionValue&
    operator[](const std::string& option) const
    {
      auto iter = m_keys.find(option);

      if (iter == m_keys.end())
      {
        throw_or_mimic<option_not_present_exception>(option);
      }

      auto viter = m_values.find(iter->second);

      if (viter == m_values.end())
      {
        throw_or_mimic<option_not_present_exception>(option);
      }

      return viter->second;
    }